

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O2

String * __thiscall cm::String::insert(String *this,size_type index,size_type count,char ch)

{
  type pSVar1;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_40);
  std::__cxx11::string::assign((char *)&local_40,(ulong)(this->view_)._M_str);
  std::__cxx11::string::insert((ulong)&local_40,index,(char)count);
  pSVar1 = operator=(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return pSVar1;
}

Assistant:

String& String::insert(size_type index, size_type count, char ch)
{
  std::string s;
  s.reserve(this->size() + count);
  s.assign(this->data(), this->size());
  s.insert(index, count, ch);
  return *this = std::move(s);
}